

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

void __thiscall
Jinx::Impl::PropertyName::PropertyName
          (PropertyName *this,VisibilityType visibility,bool readOnly,String *moduleName,
          String *propertyName,Variant *defaultValue)

{
  uint64_t uVar1;
  size_t sVar2;
  String combinedName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_50;
  
  this->m_id = 0;
  this->m_visibility = visibility;
  this->m_readOnly = readOnly;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (&this->m_name,propertyName);
  Jinx::Variant::Copy(&this->m_defaultValue,defaultValue);
  this->m_partCount = 0;
  std::operator+(&local_50,moduleName," ");
  std::operator+(&local_70,&local_50,propertyName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_50);
  uVar1 = GetHash(local_70._M_dataplus._M_p,local_70._M_string_length);
  this->m_id = uVar1;
  sVar2 = GetNamePartCount(propertyName);
  this->m_partCount = sVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_70);
  return;
}

Assistant:

inline PropertyName::PropertyName(VisibilityType visibility, bool readOnly, const String & moduleName, const String & propertyName, const Variant & defaultValue) :
		m_visibility(visibility),
		m_readOnly(readOnly),
		m_name(propertyName),
		m_defaultValue(defaultValue)
	{
		String combinedName = moduleName + " " + propertyName;
		m_id = GetHash(combinedName.c_str(), combinedName.size());
		m_partCount = GetNamePartCount(propertyName);
	}